

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_zlib_inflate_table(uchar *codes,size_t codes_len,uint16_t *zdebug_table,uint16_t *table)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  byte bVar4;
  uint local_134;
  uint16_t tprimary;
  ulong uStack_130;
  uint incr_1;
  size_t ind_1;
  ulong uStack_120;
  uint16_t tval_1;
  size_t secondary_bits;
  size_t secondary;
  size_t primary;
  uint val_1;
  uint jcnt_2;
  uint bit;
  uint m;
  uint k;
  uint jcnt_1;
  uint incr;
  size_t ind;
  uint local_d8;
  uint16_t tval;
  uint val;
  uint jcnt;
  size_t next_secondary;
  ulong uStack_c0;
  uint code;
  size_t j;
  size_t i;
  uint16_t *next;
  uint16_t firstcode [7];
  uint16_t prev [16];
  uint16_t start [16];
  uint16_t count [16];
  uint16_t *table_local;
  uint16_t *zdebug_table_local;
  size_t codes_len_local;
  uchar *codes_local;
  
  memset(start + 0xc,0,0x20);
  for (j = 0; j < codes_len; j = j + 1) {
    if (0xf < codes[j]) {
      elf_uncompress_failed();
      return 0;
    }
    uVar2 = (uint16_t)j;
    if (start[(ulong)codes[j] + 0xc] == 0) {
      prev[(ulong)codes[j] + 0xc] = uVar2;
      firstcode[(ulong)codes[j] + 3] = uVar2;
    }
    else {
      zdebug_table[(ulong)firstcode[(ulong)codes[j] + 3] + 0x800] = uVar2;
      firstcode[(ulong)codes[j] + 3] = uVar2;
    }
    start[(ulong)codes[j] + 0xc] = start[(ulong)codes[j] + 0xc] + 1;
  }
  memset(table,0,0x800);
  next_secondary._4_4_ = 0;
  for (uStack_c0 = 1; uStack_c0 < 9; uStack_c0 = uStack_c0 + 1) {
    uVar3 = (uint)start[uStack_c0 + 0xc];
    if (uVar3 != 0) {
      bVar4 = (byte)uStack_c0;
      if ((uint)(1 << (bVar4 & 0x1f)) < uVar3) {
        elf_uncompress_failed();
        return 0;
      }
      local_d8 = (uint)prev[uStack_c0 + 0xc];
      for (j = 0; j < uVar3; j = j + 1) {
        if ((local_d8 & 0xfffffe00) != 0) {
          elf_uncompress_failed();
          return 0;
        }
        for (_jcnt_1 = (ulong)next_secondary._4_4_; _jcnt_1 < 0x100;
            _jcnt_1 = (long)(1 << (bVar4 & 0x1f)) + _jcnt_1) {
          if (table[_jcnt_1] != 0) {
            elf_uncompress_failed();
            return 0;
          }
          table[_jcnt_1] = (ushort)local_d8 | ((short)uStack_c0 + -1) * 0x200;
        }
        if (j + 1 < (ulong)uVar3) {
          local_d8 = (uint)zdebug_table[(ulong)local_d8 + 0x800];
        }
        for (k = 1 << (bVar4 - 1 & 0x1f); (next_secondary._4_4_ & k) != 0; k = k >> 1) {
        }
        if (k == 0) {
          next_secondary._4_4_ = 0;
        }
        else {
          next_secondary._4_4_ = k + (k - 1 & next_secondary._4_4_);
        }
      }
    }
  }
  uStack_c0 = 9;
  do {
    if (0xf < uStack_c0) {
      _val = 0;
      uStack_c0 = 0xf;
      do {
        if (uStack_c0 < 9) {
          return 1;
        }
        uVar3 = (uint)start[uStack_c0 + 0xc];
        if (uVar3 != 0) {
          primary._4_4_ = (uint)prev[uStack_c0 + 0xc];
          next_secondary._4_4_ = (uint)*(ushort *)((long)&next + (uStack_c0 - 9) * 2 + 2);
          secondary = 0x100;
          secondary_bits = 0;
          uStack_120 = 0;
          for (j = 0; j < uVar3; j = j + 1) {
            if ((next_secondary._4_4_ & 0xff) != secondary) {
              secondary = (size_t)(next_secondary._4_4_ & 0xff);
              uVar1 = table[secondary];
              if (uVar1 == 0) {
                if ((_val & 0x1ff) != _val) {
                  elf_uncompress_failed();
                  return 0;
                }
                secondary_bits = _val;
                uStack_120 = uStack_c0 - 8;
                table[secondary] = (short)_val + ((short)uStack_c0 + -8) * 0x200 + 0x1000;
                _val = (long)(1 << ((byte)uStack_120 & 0x1f)) + _val;
              }
              else {
                if ((uVar1 & 0x1000) == 0) {
                  elf_uncompress_failed();
                  return 0;
                }
                secondary_bits = (size_t)(int)(uVar1 & 0x1ff);
                uStack_120 = (ulong)(int)((int)(uint)uVar1 >> 9 & 7);
                if (uStack_120 < uStack_c0 - 8) {
                  elf_uncompress_failed();
                  return 0;
                }
              }
            }
            for (uStack_130 = (ulong)(next_secondary._4_4_ >> 8);
                uStack_130 < (uint)(1 << ((byte)uStack_120 & 0x1f));
                uStack_130 = (uint)(1 << ((char)uStack_c0 - 8U & 0x1f)) + uStack_130) {
              if (table[secondary_bits + 0x100 + uStack_130] != 0) {
                elf_uncompress_failed();
                return 0;
              }
              table[secondary_bits + 0x100 + uStack_130] =
                   (ushort)primary._4_4_ | ((short)uStack_c0 + -8) * 0x200;
            }
            if (j + 1 < (ulong)uVar3) {
              primary._4_4_ = (uint)zdebug_table[(ulong)primary._4_4_ + 0x800];
            }
            for (local_134 = 1 << ((char)uStack_c0 - 1U & 0x1f);
                (next_secondary._4_4_ & local_134) != 0; local_134 = local_134 >> 1) {
            }
            if (local_134 == 0) {
              next_secondary._4_4_ = 0;
            }
            else {
              next_secondary._4_4_ = local_134 + (local_134 - 1 & next_secondary._4_4_);
            }
          }
        }
        uStack_c0 = uStack_c0 - 1;
      } while( true );
    }
    m = (uint)start[uStack_c0 + 0xc];
    if (m != 0) {
      *(short *)((long)&next + (uStack_c0 - 9) * 2 + 2) = (short)next_secondary._4_4_;
      for (bit = 0; bit < uStack_c0; bit = bit + 1) {
        bVar4 = (byte)bit;
        if ((m & 1 << (bVar4 & 0x1f)) != 0) {
          val_1 = 1 << (((char)uStack_c0 - bVar4) - 1 & 0x1f);
          for (jcnt_2 = 0; (ulong)jcnt_2 < uStack_c0 - bit; jcnt_2 = jcnt_2 + 1) {
            if ((next_secondary._4_4_ & val_1) == 0) {
              next_secondary._4_4_ = val_1 + next_secondary._4_4_;
              break;
            }
            next_secondary._4_4_ = (val_1 ^ 0xffffffff) & next_secondary._4_4_;
            val_1 = val_1 >> 1;
          }
          m = (1 << (bVar4 & 0x1f) ^ 0xffffffffU) & m;
        }
      }
      if (m != 0) {
        elf_uncompress_failed();
        return 0;
      }
    }
    uStack_c0 = uStack_c0 + 1;
  } while( true );
}

Assistant:

static int
elf_zlib_inflate_table (unsigned char *codes, size_t codes_len,
			uint16_t *zdebug_table, uint16_t *table)
{
  uint16_t count[16];
  uint16_t start[16];
  uint16_t prev[16];
  uint16_t firstcode[7];
  uint16_t *next;
  size_t i;
  size_t j;
  unsigned int code;
  size_t next_secondary;

  /* Count the number of code of each length.  Set NEXT[val] to be the
     next value after VAL with the same bit length.  */

  next = (uint16_t *) (((unsigned char *) zdebug_table)
		       + ZLIB_TABLE_WORK_OFFSET);

  memset (&count[0], 0, 16 * sizeof (uint16_t));
  for (i = 0; i < codes_len; ++i)
    {
      if (unlikely (codes[i] >= 16))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      if (count[codes[i]] == 0)
	{
	  start[codes[i]] = i;
	  prev[codes[i]] = i;
	}
      else
	{
	  next[prev[codes[i]]] = i;
	  prev[codes[i]] = i;
	}

      ++count[codes[i]];
    }

  /* For each length, fill in the table for the codes of that
     length.  */

  memset (table, 0, ZLIB_HUFFMAN_TABLE_SIZE * sizeof (uint16_t));

  /* Handle the values that do not require a secondary table.  */

  code = 0;
  for (j = 1; j <= 8; ++j)
    {
      unsigned int jcnt;
      unsigned int val;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      if (unlikely (jcnt > (1U << j)))
	{
	  elf_uncompress_failed ();
	  return 0;
	}

      /* There are JCNT values that have this length, the values
	 starting from START[j] continuing through NEXT[VAL].  Those
	 values are assigned consecutive values starting at CODE.  */

      val = start[j];
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  /* In the compressed bit stream, the value VAL is encoded as
	     J bits with the value C.  */

	  if (unlikely ((val & ~ZLIB_HUFFMAN_VALUE_MASK) != 0))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  tval = val | ((j - 1) << ZLIB_HUFFMAN_BITS_SHIFT);

	  /* The table lookup uses 8 bits.  If J is less than 8, we
	     don't know what the other bits will be.  We need to fill
	     in all possibilities in the table.  Since the Huffman
	     code is unambiguous, those entries can't be used for any
	     other code.  */

	  for (ind = code; ind < 0x100; ind += 1 << j)
	    {
	      if (unlikely (table[ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[ind] = tval;
	    }

	  /* Advance to the next value with this length.  */
	  if (i + 1 < jcnt)
	    val = next[val];

	  /* The Huffman codes are stored in the bitstream with the
	     most significant bit first, as is required to make them
	     unambiguous.  The effect is that when we read them from
	     the bitstream we see the bit sequence in reverse order:
	     the most significant bit of the Huffman code is the least
	     significant bit of the value we read from the bitstream.
	     That means that to make our table lookups work, we need
	     to reverse the bits of CODE.  Since reversing bits is
	     tedious and in general requires using a table, we instead
	     increment CODE in reverse order.  That is, if the number
	     of bits we are currently using, here named J, is 3, we
	     count as 000, 100, 010, 110, 001, 101, 011, 111, which is
	     to say the numbers from 0 to 7 but with the bits
	     reversed.  Going to more bits, aka incrementing J,
	     effectively just adds more zero bits as the beginning,
	     and as such does not change the numeric value of CODE.

	     To increment CODE of length J in reverse order, find the
	     most significant zero bit and set it to one while
	     clearing all higher bits.  In other words, add 1 modulo
	     2^J, only reversed.  */

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

  /* Handle the values that require a secondary table.  */

  /* Set FIRSTCODE, the number at which the codes start, for each
     length.  */

  for (j = 9; j < 16; j++)
    {
      unsigned int jcnt;
      unsigned int k;

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      /* There are JCNT values that have this length, the values
	 starting from START[j].  Those values are assigned
	 consecutive values starting at CODE.  */

      firstcode[j - 9] = code;

      /* Reverse add JCNT to CODE modulo 2^J.  */
      for (k = 0; k < j; ++k)
	{
	  if ((jcnt & (1U << k)) != 0)
	    {
	      unsigned int m;
	      unsigned int bit;

	      bit = 1U << (j - k - 1);
	      for (m = 0; m < j - k; ++m, bit >>= 1)
		{
		  if ((code & bit) == 0)
		    {
		      code += bit;
		      break;
		    }
		  code &= ~bit;
		}
	      jcnt &= ~(1U << k);
	    }
	}
      if (unlikely (jcnt != 0))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
    }

  /* For J from 9 to 15, inclusive, we store COUNT[J] consecutive
     values starting at START[J] with consecutive codes starting at
     FIRSTCODE[J - 9].  In the primary table we need to point to the
     secondary table, and the secondary table will be indexed by J - 9
     bits.  We count down from 15 so that we install the larger
     secondary tables first, as the smaller ones may be embedded in
     the larger ones.  */

  next_secondary = 0; /* Index of next secondary table (after primary).  */
  for (j = 15; j >= 9; j--)
    {
      unsigned int jcnt;
      unsigned int val;
      size_t primary; /* Current primary index.  */
      size_t secondary; /* Offset to current secondary table.  */
      size_t secondary_bits; /* Bit size of current secondary table.  */

      jcnt = count[j];
      if (jcnt == 0)
	continue;

      val = start[j];
      code = firstcode[j - 9];
      primary = 0x100;
      secondary = 0;
      secondary_bits = 0;
      for (i = 0; i < jcnt; ++i)
	{
	  uint16_t tval;
	  size_t ind;
	  unsigned int incr;

	  if ((code & 0xff) != primary)
	    {
	      uint16_t tprimary;

	      /* Fill in a new primary table entry.  */

	      primary = code & 0xff;

	      tprimary = table[primary];
	      if (tprimary == 0)
		{
		  /* Start a new secondary table.  */

		  if (unlikely ((next_secondary & ZLIB_HUFFMAN_VALUE_MASK)
				!= next_secondary))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }

		  secondary = next_secondary;
		  secondary_bits = j - 8;
		  next_secondary += 1 << secondary_bits;
		  table[primary] = (secondary
				    + ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT)
				    + (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT));
		}
	      else
		{
		  /* There is an existing entry.  It had better be a
		     secondary table with enough bits.  */
		  if (unlikely ((tprimary
				 & (1U << ZLIB_HUFFMAN_SECONDARY_SHIFT))
				== 0))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		  secondary = tprimary & ZLIB_HUFFMAN_VALUE_MASK;
		  secondary_bits = ((tprimary >> ZLIB_HUFFMAN_BITS_SHIFT)
				    & ZLIB_HUFFMAN_BITS_MASK);
		  if (unlikely (secondary_bits < j - 8))
		    {
		      elf_uncompress_failed ();
		      return 0;
		    }
		}
	    }

	  /* Fill in secondary table entries.  */

	  tval = val | ((j - 8) << ZLIB_HUFFMAN_BITS_SHIFT);

	  for (ind = code >> 8;
	       ind < (1U << secondary_bits);
	       ind += 1U << (j - 8))
	    {
	      if (unlikely (table[secondary + 0x100 + ind] != 0))
		{
		  elf_uncompress_failed ();
		  return 0;
		}
	      table[secondary + 0x100 + ind] = tval;
	    }

	  if (i + 1 < jcnt)
	    val = next[val];

	  incr = 1U << (j - 1);
	  while ((code & incr) != 0)
	    incr >>= 1;
	  if (incr == 0)
	    code = 0;
	  else
	    {
	      code &= incr - 1;
	      code += incr;
	    }
	}
    }

#ifdef BACKTRACE_GENERATE_FIXED_HUFFMAN_TABLE
  final_next_secondary = next_secondary;
#endif

  return 1;
}